

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evdevdevice.h
# Opt level: O3

bool __thiscall EvdevDevice::addDevice(EvdevDevice *this,Input *input)

{
  pointer *ppDVar1;
  iterator __position;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  Device local_18;
  
  iVar2 = access((input->path)._M_dataplus._M_p,0);
  if (iVar2 == -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ERROR: Cannot access \'",0x16);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(input->path)._M_dataplus._M_p,
                        (input->path)._M_string_length);
    pcVar5 = "\'. Does it exist?";
    lVar4 = 0x11;
  }
  else {
    local_18.fd = open((input->path)._M_dataplus._M_p,0x800);
    if (local_18.fd != 0) {
      local_18.role = input->role;
      __position._M_current =
           (this->_devices).
           super__Vector_base<EvdevDevice::Device,_std::allocator<EvdevDevice::Device>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->_devices).
          super__Vector_base<EvdevDevice::Device,_std::allocator<EvdevDevice::Device>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<EvdevDevice::Device,_std::allocator<EvdevDevice::Device>_>::
        _M_realloc_insert<EvdevDevice::Device>(&this->_devices,__position,&local_18);
      }
      else {
        *__position._M_current = local_18;
        ppDVar1 = &(this->_devices).
                   super__Vector_base<EvdevDevice::Device,_std::allocator<EvdevDevice::Device>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppDVar1 = *ppDVar1 + 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Successfully added device \'",0x1b);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(input->path)._M_dataplus._M_p,
                          (input->path)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'.",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      return true;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ERROR: Cannot open \'",0x14);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(input->path)._M_dataplus._M_p,
                        (input->path)._M_string_length);
    pcVar5 = "\'.";
    lVar4 = 2;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,lVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return false;
}

Assistant:

bool EvdevDevice::addDevice(Input const& input)
{
  if(access(input.path.data(), F_OK ) != -1)
  {
    int fd = open(input.path.data(), O_RDONLY | O_NDELAY);
    if(!fd)
    {
      std::cerr << "ERROR: Cannot open '" << input.path << "'." << std::endl;
      return false;
    }

    _devices.push_back({fd, input.role});
    std::cout << "Successfully added device '" << input.path << "'." << std::endl;
  }

  else
  {
    std::cerr << "ERROR: Cannot access '" << input.path << "'. Does it exist?" << std::endl;
    return false;
  }

  return true;
}